

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_EnumTypeCompile_Test>
::~ParameterizedTestFactory
          (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_EnumTypeCompile_Test>
           *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_0188a120;
  pcVar1 = (this->parameter_).test_name._M_dataplus._M_p;
  paVar2 = &(this->parameter_).test_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}